

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageControl::mouseReleaseEvent(PageControl *this,QMouseEvent *e)

{
  PageControlPrivate *pPVar1;
  QMouseEvent QVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double in_XMM1_Qa;
  QPoint local_28;
  
  if (*(int *)(e + 0x40) == 1) {
    if (((this->d).d)->leftButtonPressed == true) {
      dVar6 = (double)QEventPoint::position();
      pPVar1 = (this->d).d;
      iVar3 = (int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6) -
              (pPVar1->clickPos).xp;
      iVar5 = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   in_XMM1_Qa) - (pPVar1->clickPos).yp;
      iVar4 = -iVar3;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      iVar3 = -iVar5;
      if (0 < iVar5) {
        iVar3 = iVar5;
      }
      iVar5 = FingerGeometry::touchBounce();
      if (iVar3 + iVar4 <= iVar5) {
        pPVar1 = (this->d).d;
        dVar6 = (double)QEventPoint::position();
        local_28.xp = (int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6
                           );
        local_28.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                           in_XMM1_Qa);
        iVar4 = PageControlPrivate::findButton(pPVar1,&local_28);
        if (-1 < iVar4) {
          setCurrentIndex(this,iVar4);
        }
      }
    }
    ((this->d).d)->leftButtonPressed = false;
    QVar2 = (QMouseEvent)0x1;
  }
  else {
    QVar2 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar2;
  return;
}

Assistant:

void
PageControl::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			const QPoint pos = e->pos() - d->clickPos;

			if( pos.manhattanLength() <= FingerGeometry::touchBounce() )
			{
				const int index = d->findButton( e->pos() );

				if( index >= 0 )
					setCurrentIndex( index );
			}
		}

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}